

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this,
               VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  TextureFormat TVar1;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  _Var2;
  uint z;
  TestStatus *pTVar3;
  uint uVar4;
  uint y;
  IVec4 pixel;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> distinctValues;
  undefined1 local_78 [40];
  Vector<int,_4> *pVStack_50;
  long local_48;
  VkSampleCountFlagBits local_3c;
  TestStatus *local_38;
  
  local_3c = (this->super_MSInstanceBaseResolve).super_MultisampleInstanceBase.m_imageMSParams.
             numSamples;
  local_78._32_8_ = (void *)0x0;
  pVStack_50 = (Vector<int,_4> *)0x0;
  local_48 = 0;
  local_38 = __return_storage_ptr__;
  if ((imageRSInfo->extent).depth != 0) {
    uVar4 = 0;
    do {
      if ((imageRSInfo->extent).height != 0) {
        z = 0;
        do {
          if ((imageRSInfo->extent).width != 0) {
            y = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_78,(int)dataRS,y,z);
              _Var2 = std::
                      __find_if<__gnu_cxx::__normal_iterator<tcu::Vector<int,4>*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>,__gnu_cxx::__ops::_Iter_equals_val<tcu::Vector<int,4>const>>
                                (local_78._32_8_,pVStack_50,local_78);
              if (_Var2._M_current == pVStack_50) {
                std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           (local_78 + 0x20),(value_type *)local_78);
              }
              y = y + 1;
            } while (y < (imageRSInfo->extent).width);
          }
          z = z + 1;
        } while (z < (imageRSInfo->extent).height);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (imageRSInfo->extent).depth);
  }
  TVar1 = (TextureFormat)((long)local_78 + 0x10);
  local_78._0_8_ = TVar1;
  if ((ulong)((long)pVStack_50 - local_78._32_8_ >> 4) < (ulong)(local_3c + VK_SAMPLE_COUNT_1_BIT))
  {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Expected numSamples+1 different colors in the output image","");
    pTVar3 = local_38;
    local_38->m_code = QP_TEST_RESULT_FAIL;
    (local_38->m_description)._M_dataplus._M_p = (pointer)&(local_38->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38->m_description,local_78._0_8_,
               (undefined1 *)(local_78._8_8_ + local_78._0_8_));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Passed","");
    pTVar3 = local_38;
    local_38->m_code = QP_TEST_RESULT_PASS;
    (local_38->m_description)._M_dataplus._M_p = (pointer)&(local_38->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38->m_description,local_78._0_8_,
               (undefined1 *)(local_78._8_8_ + local_78._0_8_));
  }
  if ((TextureFormat)local_78._0_8_ != TVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if ((void *)local_78._32_8_ != (void *)0x0) {
    operator_delete((void *)local_78._32_8_,local_48 - local_78._32_8_);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceDistinctValues>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	const deUint32 distinctValuesExpected = static_cast<deUint32>(m_imageMSParams.numSamples) + 1u;

	std::vector<tcu::IVec4> distinctValues;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;	 ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;	 ++x)
	{
		const tcu::IVec4 pixel = dataRS.getPixelInt(x, y, z);

		if (std::find(distinctValues.begin(), distinctValues.end(), pixel) == distinctValues.end())
			distinctValues.push_back(pixel);
	}

	if (distinctValues.size() >= distinctValuesExpected)
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Expected numSamples+1 different colors in the output image");
}